

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  BYTE *prefixStart;
  undefined8 uVar7;
  seq_t sequence;
  bool bVar8;
  ulong uVar9;
  U32 i;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  BYTE *pBVar15;
  uint uVar16;
  BYTE *pBVar17;
  ulong uVar18;
  BYTE *pBVar19;
  ulong uVar20;
  BYTE *pBVar21;
  BYTE *__dest;
  ulong __n;
  void *pvVar22;
  int iVar23;
  BYTE *oend;
  BYTE *litPtr;
  BIT_DStream_t local_128;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ulong local_d0 [6];
  BYTE *local_a0;
  uint local_94;
  void *local_90;
  BYTE *local_88;
  BYTE *local_80;
  ZSTD_DCtx *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong uStack_40;
  BYTE *pBStack_38;
  
  if (dctx->bmi2 != 0) {
    sVar11 = ZSTD_decompressSequences_bmi2(dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar11;
  }
  oend = (BYTE *)(maxDstSize + (long)dst);
  local_a0 = dctx->litPtr;
  pBVar21 = local_a0 + dctx->litSize;
  pvVar22 = dst;
  if (nbSeq == 0) goto LAB_0016b2cb;
  prefixStart = (BYTE *)dctx->prefixStart;
  local_80 = (BYTE *)dctx->virtualStart;
  local_88 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar12 = -0xc;
  do {
    *(ulong *)((long)local_d0 + lVar12 * 2 + 0x18) =
         (ulong)*(uint *)((long)dctx->workspace + lVar12);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0);
  if (seqSize == 0) {
    local_128.bitContainer = 0;
    local_128._8_8_ = 0;
    local_128.ptr = (char *)0x0;
    local_128.start = (char *)0x0;
    local_128.limitPtr = (char *)0x0;
LAB_0016aa05:
    bVar8 = false;
    sVar11 = 0xffffffffffffffec;
    pvVar22 = dst;
  }
  else {
    local_128.limitPtr = (char *)((long)seqStart + 8);
    local_128.start = (char *)seqStart;
    if (seqSize < 8) {
      local_128.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_128.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_128.bitContainer;
      case 6:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar16 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar16 + 9;
      if (bVar2 == 0) {
        local_128.bitsConsumed = 0;
      }
      local_128.ptr = (char *)seqStart;
      if (bVar2 == 0) goto LAB_0016aa05;
      local_128.bitsConsumed = local_128.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_128.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_128.bitContainer = *(size_t *)local_128.ptr;
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar16 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar16 + 9;
      if (bVar2 == 0) {
        local_128.bitsConsumed = 0;
      }
      if (bVar2 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_0016aa05;
    }
    ZSTD_initFseState(&local_100,&local_128,dctx->LLTptr);
    ZSTD_initFseState(&local_f0,&local_128,dctx->OFTptr);
    local_78 = dctx;
    ZSTD_initFseState(&local_e0,&local_128,dctx->MLTptr);
    local_70 = oend + -0x20;
    uVar18 = 0;
    local_90 = dst;
    do {
      uVar9 = local_d0[1];
      local_68 = uVar18;
      uVar6 = local_100.table[local_100.state].nextState;
      bVar2 = local_100.table[local_100.state].nbAdditionalBits;
      bVar3 = local_100.table[local_100.state].nbBits;
      uVar18 = (ulong)local_100.table[local_100.state].baseValue;
      local_58 = (ulong)local_e0.table[local_e0.state].nextState;
      bVar14 = local_e0.table[local_e0.state].nbAdditionalBits;
      bVar4 = local_e0.table[local_e0.state].nbBits;
      __n = (ulong)local_e0.table[local_e0.state].baseValue;
      bVar5 = local_f0.table[local_f0.state].nbAdditionalBits;
      local_94 = (uint)local_f0.table[local_f0.state].nbBits;
      local_60 = (ulong)local_f0.table[local_f0.state].nextState;
      bVar13 = (byte)local_128.bitsConsumed;
      if (bVar5 < 2) {
        if (bVar5 != 0) {
          local_128.bitsConsumed = local_128.bitsConsumed + 1;
          lVar12 = (ulong)(local_f0.table[local_f0.state].baseValue + (uint)(uVar18 == 0)) -
                   ((long)(local_128.bitContainer << (bVar13 & 0x3f)) >> 0x3f);
          if (lVar12 == 3) {
            uVar20 = local_d0[0] - 1;
          }
          else {
            uVar20 = local_d0[lVar12];
          }
          uVar20 = uVar20 + (uVar20 == 0);
          if (lVar12 != 1) {
            local_d0[2] = local_d0[1];
          }
LAB_0016b173:
          local_d0[1] = local_d0[0];
          goto LAB_0016ac20;
        }
        uVar20 = local_d0[1];
        if (uVar18 == 0) goto LAB_0016b173;
      }
      else {
        if (0x1f < bVar5) {
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6407,
                        "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                       );
        }
        local_128.bitsConsumed = local_128.bitsConsumed + bVar5;
        uVar20 = ((local_128.bitContainer << (bVar13 & 0x3f)) >> (-bVar5 & 0x3f)) +
                 (ulong)local_f0.table[local_f0.state].baseValue;
        local_d0[1] = local_d0[0];
        local_d0[2] = uVar9;
LAB_0016ac20:
        local_d0[1] = local_d0[0];
        local_d0[0] = uVar20;
      }
      uVar9 = local_d0[0];
      if (bVar14 != 0) {
        bVar13 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar14;
        __n = __n + ((local_128.bitContainer << (bVar13 & 0x3f)) >> (-bVar14 & 0x3f));
      }
      if (0x1e < (byte)(bVar14 + bVar2 + bVar5)) {
        BIT_reloadDStream(&local_128);
      }
      if (bVar2 != 0) {
        bVar14 = (byte)local_128.bitsConsumed;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
        uVar18 = uVar18 + ((local_128.bitContainer << (bVar14 & 0x3f)) >> (-bVar2 & 0x3f));
      }
      if (0x1f < bVar3) {
LAB_0016b332:
        __assert_fail("nbBits < BIT_MASK_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
      }
      iVar23 = bVar3 + local_128.bitsConsumed;
      local_100.state =
           (ulong)((uint)(local_128.bitContainer >> (-(char)iVar23 & 0x3fU)) & BIT_mask[bVar3]) +
           (ulong)uVar6;
      local_128.bitsConsumed = iVar23;
      if (0x1f < bVar4) goto LAB_0016b332;
      local_128.bitsConsumed = iVar23 + (uint)bVar4;
      local_e0.state =
           ((uint)(local_128.bitContainer >> (-(char)local_128.bitsConsumed & 0x3fU)) &
           BIT_mask[(uint)bVar4]) + local_58;
      if (0x1f < (byte)local_94) goto LAB_0016b332;
      local_f0.state =
           ((uint)(local_128.bitContainer >> (-(char)(local_128.bitsConsumed + local_94) & 0x3fU)) &
           BIT_mask[local_94]) + local_60;
      local_128.bitsConsumed = local_128.bitsConsumed + local_94;
      uVar20 = uVar18 + __n;
      if ((long)uVar20 <= (long)uVar18) {
        __assert_fail("oLitEnd < oMatchEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6386,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      pBVar19 = local_a0 + uVar18;
      if ((pBVar21 < pBVar19) || (pBVar1 = (BYTE *)((long)dst + uVar20), local_70 < pBVar1)) {
        sequence.matchLength = __n;
        sequence.litLength = uVar18;
        sequence.offset = uVar9;
        sequence.match = pBStack_38;
        local_50 = uVar18;
        sStack_48 = __n;
        uStack_40 = uVar9;
        uVar20 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,oend,sequence,&local_a0,pBVar21,prefixStart,local_80,
                            local_88);
      }
      else {
        __dest = (BYTE *)((long)dst + uVar18);
        if (local_70 < __dest) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x638c,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar7 = *(undefined8 *)(local_a0 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_a0;
        *(undefined8 *)((long)dst + 8) = uVar7;
        if (0x10 < uVar18) {
          ZSTD_decompressSequences();
        }
        local_a0 = pBVar19;
        pBVar19 = __dest + -uVar9;
        if ((ulong)((long)__dest - (long)prefixStart) < uVar9) {
          if ((ulong)((long)__dest - (long)local_80) < uVar9) {
            uVar20 = 0xffffffffffffffec;
          }
          else {
            lVar12 = (long)(__dest + -uVar9) - (long)prefixStart;
            pBVar19 = local_88 + lVar12;
            if (local_88 < pBVar19 + __n) {
              memmove(__dest,pBVar19,-lVar12);
              __dest = __dest + -lVar12;
              __n = __n + lVar12;
              pBVar19 = prefixStart;
              goto LAB_0016ae1f;
            }
            memmove(__dest,pBVar19,__n);
          }
        }
        else {
LAB_0016ae1f:
          if (pBVar1 < __dest) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ac,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar19 < prefixStart) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ae,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (__n == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63af,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uVar9 < 0x10) {
            if (__dest < pBVar19) {
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (uVar9 < 8) {
              iVar23 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar9 * 4);
              *__dest = *pBVar19;
              __dest[1] = pBVar19[1];
              __dest[2] = pBVar19[2];
              __dest[3] = pBVar19[3];
              pBVar15 = pBVar19 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar9 * 4);
              pBVar19 = pBVar19 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4) - (long)iVar23);
              *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar15;
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pBVar19;
            }
            pBVar15 = pBVar19 + 8;
            pBVar17 = __dest + 8;
            lVar12 = (long)pBVar17 - (long)pBVar15;
            if (lVar12 < 8) {
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (8 < __n) {
              if (pBVar1 <= pBVar17) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x63c3,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (lVar12 < 0x10) {
                do {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                  pBVar17 = pBVar17 + 8;
                  pBVar15 = pBVar15 + 8;
                } while (pBVar17 < __dest + __n);
              }
              else {
                if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_0016b3ec;
                uVar7 = *(undefined8 *)(pBVar19 + 0x10);
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar15;
                *(undefined8 *)(__dest + 0x10) = uVar7;
                if (0x18 < (long)__n) {
                  lVar12 = 0;
                  do {
                    uVar7 = *(undefined8 *)(pBVar19 + lVar12 + 0x18 + 8);
                    pBVar1 = __dest + lVar12 + 0x18;
                    *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar19 + lVar12 + 0x18);
                    *(undefined8 *)(pBVar1 + 8) = uVar7;
                    uVar7 = *(undefined8 *)(pBVar19 + lVar12 + 0x28 + 8);
                    *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar19 + lVar12 + 0x28);
                    *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                    lVar12 = lVar12 + 0x20;
                  } while (pBVar1 + 0x20 < __dest + __n);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe8 < __dest + (-8 - (long)pBVar19)) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar19)) {
LAB_0016b3ec:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(pBVar19 + 8);
            *(undefined8 *)__dest = *(undefined8 *)pBVar19;
            *(undefined8 *)(__dest + 8) = uVar7;
            if (0x10 < (long)__n) {
              lVar12 = 0x10;
              do {
                uVar7 = *(undefined8 *)(pBVar19 + lVar12 + 8);
                pBVar1 = __dest + lVar12;
                *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar19 + lVar12);
                *(undefined8 *)(pBVar1 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar19 + lVar12 + 0x10 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar19 + lVar12 + 0x10);
                *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                lVar12 = lVar12 + 0x20;
              } while (pBVar1 + 0x20 < __dest + __n);
            }
          }
        }
      }
      if (local_128.bitsConsumed < 0x41) {
        if (local_128.ptr < local_128.limitPtr) {
          if (local_128.ptr == local_128.start) goto LAB_0016af34;
          uVar16 = (int)local_128.ptr - (int)local_128.start;
          if (local_128.start <=
              (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
            uVar16 = local_128.bitsConsumed >> 3;
          }
          uVar10 = local_128.bitsConsumed + uVar16 * -8;
        }
        else {
          uVar16 = local_128.bitsConsumed >> 3;
          uVar10 = local_128.bitsConsumed & 7;
        }
        local_128.ptr = (char *)((long)local_128.ptr - (ulong)uVar16);
        local_128.bitsConsumed = uVar10;
        local_128.bitContainer = *(size_t *)local_128.ptr;
      }
LAB_0016af34:
      uVar18 = local_68;
      if (0xffffffffffffff88 < uVar20) {
        uVar18 = uVar20;
        uVar20 = 0;
      }
      dst = (void *)((long)dst + uVar20);
      nbSeq = nbSeq + -1;
    } while (nbSeq != 0);
    sVar11 = 0xffffffffffffffec;
    pvVar22 = local_90;
    if (uVar18 < 0xffffffffffffff89) {
      if (local_128.bitsConsumed < 0x41) {
        if (local_128.ptr < local_128.limitPtr) {
          if (local_128.ptr != local_128.start) {
            uVar18 = (ulong)(uint)((int)local_128.ptr - (int)local_128.start);
            if (local_128.start <=
                (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
              uVar18 = (ulong)(local_128.bitsConsumed >> 3);
            }
            local_128.ptr = (char *)((long)local_128.ptr - uVar18);
            local_128.bitsConsumed = local_128.bitsConsumed + (int)uVar18 * -8;
            local_128.bitContainer = *(size_t *)local_128.ptr;
            bVar8 = false;
            sVar11 = 0xffffffffffffffec;
            goto LAB_0016b2c7;
          }
          if (local_128.bitsConsumed == 0x40) goto LAB_0016b20f;
        }
        else {
          local_128.ptr = (char *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3));
          local_128._8_8_ = local_128._8_8_ & 0xffffffff00000007;
          local_128.bitContainer = *(size_t *)local_128.ptr;
        }
        sVar11 = 0xffffffffffffffec;
        bVar8 = false;
      }
      else {
LAB_0016b20f:
        lVar12 = 0;
        do {
          (local_78->entropy).rep[lVar12] = (U32)local_d0[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        bVar8 = true;
      }
    }
    else {
      bVar8 = false;
      sVar11 = uVar18;
    }
  }
LAB_0016b2c7:
  if (!bVar8) {
    return sVar11;
  }
LAB_0016b2cb:
  uVar18 = (long)pBVar21 - (long)local_a0;
  if ((ulong)((long)oend - (long)dst) < uVar18) {
    pBVar21 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(dst,local_a0,uVar18);
    pBVar21 = (BYTE *)((long)dst + (uVar18 - (long)pvVar22));
  }
  return (size_t)pBVar21;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}